

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeAddWindow(ImGuiDockNode *node,ImGuiWindow *window,bool add_to_tab_bar)

{
  float fVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ImGuiTabBar *tab_bar;
  long lVar5;
  ImGuiWindow **ppIVar6;
  bool bVar7;
  int local_2c;
  int n;
  ImGuiContext *g;
  ImGuiWindow *pIStack_18;
  bool add_to_tab_bar_local;
  ImGuiWindow *window_local;
  ImGuiDockNode *node_local;
  
  pIStack_18 = window;
  window_local = (ImGuiWindow *)node;
  if (window->DockNode != (ImGuiDockNode *)0x0) {
    if (window->DockNode->ID == node->ID) {
      __assert_fail("window->DockNode->ID != node->ID",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x311c,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
    }
    DockNodeRemoveWindow(window->DockNode,window,0);
  }
  bVar7 = true;
  if (pIStack_18->DockNode != (ImGuiDockNode *)0x0) {
    bVar7 = pIStack_18->DockNodeAsHost == (ImGuiDockNode *)0x0;
  }
  if (bVar7) {
    ImVector<ImGuiWindow_*>::push_back
              ((ImVector<ImGuiWindow_*> *)&(window_local->WindowClass).DockNodeFlagsOverrideClear,
               &stack0xffffffffffffffe8);
    *(byte *)((long)&(window_local->ScrollbarSizes).y + 2) =
         *(byte *)((long)&(window_local->ScrollbarSizes).y + 2) & 0xfd | 2;
    pIStack_18->DockNode = (ImGuiDockNode *)window_local;
    pIStack_18->DockId = *(ImGuiID *)&window_local->Name;
    pIStack_18->field_0x492 =
         pIStack_18->field_0x492 & 0xfe | 1 < (window_local->WindowClass).DockNodeFlagsOverrideClear
    ;
    pIStack_18->field_0x492 = pIStack_18->field_0x492 & 0xfb;
    lVar2._0_4_ = window_local->NameBufLen;
    lVar2._4_4_ = window_local->MoveId;
    if (((lVar2 == 0) && ((window_local->WindowClass).DockNodeFlagsOverrideClear == 2)) &&
       (ppIVar6 = ImVector<ImGuiWindow_*>::operator[]
                            ((ImVector<ImGuiWindow_*> *)
                             &(window_local->WindowClass).DockNodeFlagsOverrideClear,0),
       ((*ppIVar6)->WasActive & 1U) == 0)) {
      ppIVar6 = ImVector<ImGuiWindow_*>::operator[]
                          ((ImVector<ImGuiWindow_*> *)
                           &(window_local->WindowClass).DockNodeFlagsOverrideClear,0);
      (*ppIVar6)->Hidden = true;
      ppIVar6 = ImVector<ImGuiWindow_*>::operator[]
                          ((ImVector<ImGuiWindow_*> *)
                           &(window_local->WindowClass).DockNodeFlagsOverrideClear,0);
      (*ppIVar6)->HiddenFramesCanSkipItems = 1;
    }
    lVar3._0_4_ = window_local->NameBufLen;
    lVar3._4_4_ = window_local->MoveId;
    if ((lVar3 == 0) &&
       (bVar7 = ImGuiDockNode::IsFloatingNode((ImGuiDockNode *)window_local), bVar7)) {
      if ((short)(*(short *)&(window_local->ScrollbarSizes).y << 0xd) >> 0xd == 0) {
        *(ushort *)&(window_local->ScrollbarSizes).y =
             *(ushort *)&(window_local->ScrollbarSizes).y & 0xfff8 | 2;
      }
      if ((short)(*(short *)&(window_local->ScrollbarSizes).y << 10) >> 0xd == 0) {
        *(ushort *)&(window_local->ScrollbarSizes).y =
             *(ushort *)&(window_local->ScrollbarSizes).y & 0xffc7 | 0x10;
      }
      if ((short)(*(short *)&(window_local->ScrollbarSizes).y << 7) >> 0xd == 0) {
        *(ushort *)&(window_local->ScrollbarSizes).y =
             *(ushort *)&(window_local->ScrollbarSizes).y & 0xfe3f | 0x80;
      }
    }
    if (add_to_tab_bar) {
      lVar4._0_4_ = window_local->ViewportId;
      lVar4._4_4_ = (window_local->ViewportPos).x;
      if (lVar4 == 0) {
        DockNodeAddTabBar((ImGuiDockNode *)window_local);
        fVar1 = (window_local->ScrollTargetEdgeSnapDist).y;
        *(float *)(*(long *)&window_local->ViewportId + 0x1c) = fVar1;
        *(float *)(*(long *)&window_local->ViewportId + 0x18) = fVar1;
        for (local_2c = 0; local_2c < (window_local->WindowClass).DockNodeFlagsOverrideClear + -1;
            local_2c = local_2c + 1) {
          tab_bar = *(ImGuiTabBar **)&window_local->ViewportId;
          ppIVar6 = ImVector<ImGuiWindow_*>::operator[]
                              ((ImVector<ImGuiWindow_*> *)
                               &(window_local->WindowClass).DockNodeFlagsOverrideClear,local_2c);
          TabBarAddTab(tab_bar,0,*ppIVar6);
        }
      }
      TabBarAddTab(*(ImGuiTabBar **)&window_local->ViewportId,0x400000,pIStack_18);
    }
    DockNodeUpdateVisibleFlag((ImGuiDockNode *)window_local);
    lVar5._0_4_ = window_local->NameBufLen;
    lVar5._4_4_ = window_local->MoveId;
    if (lVar5 != 0) {
      UpdateWindowParentAndRootLinks
                (pIStack_18,pIStack_18->Flags | 0x1000000,*(ImGuiWindow **)&window_local->NameBufLen
                );
    }
    return;
  }
  __assert_fail("window->DockNode == __null || window->DockNodeAsHost == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x311f,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
}

Assistant:

static void ImGui::DockNodeAddWindow(ImGuiDockNode* node, ImGuiWindow* window, bool add_to_tab_bar)
{
    ImGuiContext& g = *GImGui; (void)g;
    if (window->DockNode)
    {
        // Can overwrite an existing window->DockNode (e.g. pointing to a disabled DockSpace node)
        IM_ASSERT(window->DockNode->ID != node->ID);
        DockNodeRemoveWindow(window->DockNode, window, 0);
    }
    IM_ASSERT(window->DockNode == NULL || window->DockNodeAsHost == NULL);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeAddWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    node->Windows.push_back(window);
    node->WantHiddenTabBarUpdate = true;
    window->DockNode = node;
    window->DockId = node->ID;
    window->DockIsActive = (node->Windows.Size > 1);
    window->DockTabWantClose = false;

    // If more than 2 windows appeared on the same frame, we'll create a new hosting DockNode from the point of the second window submission.
    // Then we need to hide the first window (after its been output) otherwise it would be visible as a standalone window for one frame.
    if (node->HostWindow == NULL && node->Windows.Size == 2 && node->Windows[0]->WasActive == false)
    {
        node->Windows[0]->Hidden = true;
        node->Windows[0]->HiddenFramesCanSkipItems = 1;
    }

    // When reactivating a node with one or two loose window, the window pos/size/viewport are authoritative over the node storage.
    // In particular it is important we init the viewport from the first window so we don't create two viewports and drop one.
    if (node->HostWindow == NULL && node->IsFloatingNode())
    {
        if (node->AuthorityForPos == ImGuiDataAuthority_Auto)
            node->AuthorityForPos = ImGuiDataAuthority_Window;
        if (node->AuthorityForSize == ImGuiDataAuthority_Auto)
            node->AuthorityForSize = ImGuiDataAuthority_Window;
        if (node->AuthorityForViewport == ImGuiDataAuthority_Auto)
            node->AuthorityForViewport = ImGuiDataAuthority_Window;
    }

    // Add to tab bar if requested
    if (add_to_tab_bar)
    {
        if (node->TabBar == NULL)
        {
            DockNodeAddTabBar(node);
            node->TabBar->SelectedTabId = node->TabBar->NextSelectedTabId = node->SelectedTabId;

            // Add existing windows
            for (int n = 0; n < node->Windows.Size - 1; n++)
                TabBarAddTab(node->TabBar, ImGuiTabItemFlags_None, node->Windows[n]);
        }
        TabBarAddTab(node->TabBar, ImGuiTabItemFlags_Unsorted, window);
    }

    DockNodeUpdateVisibleFlag(node);

    // Update this without waiting for the next time we Begin() in the window, so our host window will have the proper title bar color on its first frame.
    if (node->HostWindow)
        UpdateWindowParentAndRootLinks(window, window->Flags | ImGuiWindowFlags_ChildWindow, node->HostWindow);
}